

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# def_to_proto_test.cc
# Opt level: O2

void __thiscall upb_test::FuzzTest_NanValue_Test::TestBody(FuzzTest_NanValue_Test *this)

{
  string_view text_proto;
  ParseTextProtoOrDie local_70;
  FileDescriptorSet local_50;
  
  text_proto._M_str =
       "file {\n             enum_type {\n               value {\n                 number: 0\n                 options { uninterpreted_option { double_value: nan } }\n               }\n             }\n           }"
  ;
  text_proto._M_len = 0xc6;
  ParseTextProtoOrDie::ParseTextProtoOrDie(&local_70,text_proto);
  ParseTextProtoOrDie::operator_cast_to_FileDescriptorSet(&local_50,&local_70);
  RoundTripDescriptor(&local_50);
  google::protobuf::FileDescriptorSet::~FileDescriptorSet(&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

TEST(FuzzTest, NanValue) {
  RoundTripDescriptor(ParseTextProtoOrDie(
      R"pb(file {
             enum_type {
               value {
                 number: 0
                 options { uninterpreted_option { double_value: nan } }
               }
             }
           })pb"));
}